

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blargg_common.h
# Opt level: O0

blargg_err_t __thiscall blargg_vector<char>::resize(blargg_vector<char> *this,size_t n)

{
  void *pvVar1;
  size_t in_RSI;
  undefined8 *in_RDI;
  void *p;
  blargg_err_t local_8;
  
  pvVar1 = realloc((void *)*in_RDI,in_RSI);
  if ((pvVar1 == (void *)0x0) && (in_RSI != 0)) {
    local_8 = "Out of memory";
  }
  else {
    *in_RDI = pvVar1;
    in_RDI[1] = in_RSI;
    local_8 = (blargg_err_t)0x0;
  }
  return local_8;
}

Assistant:

blargg_err_t resize( size_t n )
	{
		void* p = realloc( begin_, n * sizeof (T) );
		if ( !p && n )
			return "Out of memory";
		begin_ = (T*) p;
		size_ = n;
		return 0;
	}